

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_jump(command *cmd)

{
  loc grid;
  player *ppVar1;
  _Bool _Var2;
  wchar_t wVar3;
  trap_kind_conflict *ptVar4;
  loc lVar5;
  wchar_t dir;
  wchar_t local_1c;
  
  wVar3 = cmd_get_direction((command_conflict *)cmd,"direction",&local_1c,false);
  if (wVar3 == L'\0') {
    lVar5.x = (player->grid).x;
    lVar5.y = (player->grid).y;
    _Var2 = square_iswebbed(cave,lVar5);
    if (_Var2) {
      ptVar4 = lookup_trap("web");
      msg("You clear the web.");
      if (ptVar4 == (trap_kind_conflict *)0x0) {
        __assert_fail("web",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-cave.c"
                      ,0x615,"void do_cmd_jump(struct command *)");
      }
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_remove_all_traps_of_type((chunk *)cave,grid,ptVar4->tidx);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      _Var2 = player_confuse_dir(player,&local_1c,false);
      ppVar1 = player;
      if (_Var2) {
        player->upkeep->energy_use = (uint)z_info->move_energy;
      }
      lVar5 = (loc)loc_sum(ppVar1->grid,(loc_conflict)ddgrid[local_1c]);
      _Var2 = do_cmd_walk_test(player,lVar5);
      if (_Var2) {
        wVar3 = energy_per_move(player);
        player->upkeep->energy_use = wVar3;
        move_player(local_1c,false);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_jump(struct command *cmd)
{
	struct loc grid;
	int dir;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		struct trap_kind *web = lookup_trap("web");

		msg("You clear the web.");
		assert(web);
		square_remove_all_traps_of_type(cave, player->grid, web->tidx);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}

	/* Apply confusion if necessary */
	if (player_confuse_dir(player, &dir, false))
		player->upkeep->energy_use = z_info->move_energy;

	/* Verify walkability */
	grid = loc_sum(player->grid, ddgrid[dir]);
	if (!do_cmd_walk_test(player, grid))
		return;

	player->upkeep->energy_use = energy_per_move(player);

	move_player(dir, false);
}